

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.h
# Opt level: O0

uint __thiscall Network::compute_triangles(Network *this,uint node_i)

{
  uint uVar1;
  bool bVar2;
  const_reference pvVar3;
  reference puVar4;
  size_type sVar5;
  uint local_54;
  iterator iStack_50;
  uint node_k;
  iterator __end2;
  iterator __begin2;
  value_type *__range2;
  iterator iStack_30;
  uint node_j;
  iterator __end1;
  iterator __begin1;
  value_type *__range1;
  uint triangles;
  uint node_i_local;
  Network *this_local;
  
  __range1._0_4_ = 0;
  pvVar3 = std::
           vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
           ::operator[](&this->links,(ulong)node_i);
  __end1 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                     (pvVar3);
  iStack_30 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                        (pvVar3);
  while( true ) {
    bVar2 = std::operator!=(&__end1,&stack0xffffffffffffffd0);
    if (!bVar2) break;
    puVar4 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end1);
    uVar1 = *puVar4;
    pvVar3 = std::
             vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             ::operator[](&this->links,(ulong)node_i);
    __end2 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                       (pvVar3);
    iStack_50 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                          (pvVar3);
    while( true ) {
      bVar2 = std::operator!=(&__end2,&stack0xffffffffffffffb0);
      if (!bVar2) break;
      puVar4 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&__end2);
      local_54 = *puVar4;
      if (local_54 != uVar1) {
        pvVar3 = std::
                 vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](&this->links,(ulong)uVar1);
        sVar5 = std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::
                count(pvVar3,&local_54);
        if (sVar5 != 0) {
          __range1._0_4_ = (uint)__range1 + 1;
        }
      }
      std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end2);
    }
    std::_Rb_tree_const_iterator<unsigned_int>::operator++(&__end1);
  }
  return (uint)__range1 >> 1;
}

Assistant:

unsigned int compute_triangles(unsigned int node_i) const {
        unsigned int triangles = 0;
        for (unsigned int node_j : links[node_i])
            for (unsigned int node_k : links[node_i])
                if (node_k != node_j and links[node_j].count(node_k))
                    triangles++;
        return triangles/2;
    }